

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRect __thiscall
QStyleSheetStyle::subElementRect(QStyleSheetStyle *this,SubElement se,QStyleOption *opt,QWidget *w)

{
  undefined4 uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [12];
  QStyleSheetStyle *pQVar8;
  undefined1 *puVar9;
  bool bVar10;
  bool bVar11;
  QStyle *pQVar12;
  QTabBar *this_00;
  QSize QVar13;
  undefined8 uVar14;
  QRect *pQVar15;
  undefined4 uVar16;
  int iVar17;
  QPalette *pQVar18;
  LayoutDirection LVar19;
  QRenderRule *pQVar20;
  int iVar21;
  SubElement sr;
  long in_FS_OFFSET;
  QRect QVar22;
  undefined1 auVar23 [16];
  QStyleOptionButton btnOpt;
  QRenderRule subRule2;
  QRenderRule subRule;
  QRenderRule rule;
  undefined1 *local_2e0;
  QRect local_2d8;
  undefined1 local_2c8 [12];
  Representation RStack_2bc;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  undefined1 local_2a8 [12];
  Representation RStack_29c;
  undefined1 local_298 [16];
  undefined1 *local_288;
  QHash<QString,_QVariant> QStack_280;
  QSharedDataPointer<QStyleSheetPaletteData> local_278;
  QSharedDataPointer<QStyleSheetBoxData> QStack_270;
  QSharedDataPointer<QStyleSheetBackgroundData> local_268;
  QSharedDataPointer<QStyleSheetBorderData> QStack_260;
  QSize local_258;
  QSharedDataPointer<QStyleSheetGeometryData> QStack_250;
  QSharedDataPointer<QStyleSheetPositionData> local_248;
  QSize QStack_240;
  QRenderRule local_1d8;
  QRenderRule local_148;
  QRenderRule local_c0;
  long local_38;
  
  pQVar8 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar12 = baseStyle(this);
    _local_2c8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,se,opt,w);
    goto LAB_00369677;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_c0,0xaa,0x88);
  bVar10 = false;
  renderRule(&local_c0,this,&w->super_QObject,opt,0);
  iVar21 = 0x36;
  sr = SE_TabWidgetTabPane;
  switch(se) {
  case SE_PushButtonContents:
  case SE_PushButtonFocusRect:
  case SE_PushButtonBevel:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 2)) break;
    if (((opt[1].version & 2) == 0) || (bVar10 = hasStyleRule(this,&w->super_QObject,7), !bVar10)) {
      if ((local_c0.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
         ((local_c0.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
          (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d
            ).ptr == (QStyleSheetBorderImageData *)0x0 &&
           (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
        bVar10 = QRenderRule::baseStyleCanDraw(&local_c0);
        if (bVar10) {
          pQVar12 = baseStyle(this);
          _local_2c8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,se,opt,w);
        }
        else {
          _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,se,opt,w);
        }
      }
      else {
        LVar19 = opt->direction;
        pQVar15 = &opt->rect;
        if (se == SE_PushButtonBevel) {
          _local_2a8 = QRenderRule::borderRect(&local_c0,pQVar15);
        }
        else {
          _local_2a8 = QRenderRule::contentsRect(&local_c0,pQVar15);
        }
        _local_2c8 = QStyle::visualRect(LVar19,pQVar15,(QRect *)local_2a8);
      }
    }
    else {
      local_248.d.ptr = (totally_ordered_wrapper<QStyleSheetPositionData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_240 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_258 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QStack_250.d.ptr = (totally_ordered_wrapper<QStyleSheetGeometryData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_268.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_260.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_278.d.ptr = (totally_ordered_wrapper<QStyleSheetPaletteData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_270.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_288 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_280.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_298._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffd60 = &DAT_aaaaaaaaaaaaaaaa;
      local_2a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton
                ((QStyleOptionButton *)local_2a8,(QStyleOptionButton *)opt);
      local_268.d.ptr =
           (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
           ((ulong)local_268.d.ptr & 0xfffffffffffffffd);
      bVar10 = QRenderRule::baseStyleCanDraw(&local_c0);
      if (bVar10) {
        pQVar12 = baseStyle(this);
        _local_2c8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,se,local_2a8,w);
      }
      else {
        _local_2c8 = QWindowsStyle::subElementRect
                               ((QWindowsStyle *)this,se,(QStyleOption *)local_2a8,w);
      }
      QStyleOptionButton::~QStyleOptionButton((QStyleOptionButton *)local_2a8);
    }
    goto LAB_0036965a;
  case SE_CheckBoxIndicator:
  case SE_RadioButtonIndicator:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
         local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (bVar10 = hasStyleRule(this,&w->super_QObject,5), bVar10)) {
      iVar21 = (se != SE_CheckBoxIndicator) + 5;
      memset((QRenderRule *)local_2a8,0xaa,0x88);
      renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar21);
      LVar19 = opt->direction;
      goto LAB_003691d1;
    }
    break;
  case SE_CheckBoxContents:
  case SE_RadioButtonContents:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
         local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (bVar10 = hasStyleRule(this,&w->super_QObject,5), bVar10)) {
      uVar16 = 0x43;
      if (se == SE_RadioButtonContents) {
        uVar16 = 0x4a;
      }
      _local_2a8 = (QRect)(**(code **)(*(long *)this + 0xc0))
                                    (this,(se == SE_RadioButtonContents) * '\x04' + '\x02',opt,w);
      _local_2a8 = QStyle::visualRect(opt->direction,&opt->rect,(QRect *)local_2a8);
      iVar21 = (**(code **)(*(long *)this + 0xe0))(this,uVar16,0,w);
      QVar22 = QRenderRule::contentsRect(&local_c0,&opt->rect);
      iVar17 = local_2a8._8_4_ + 1 + local_2a8._0_4_;
      local_2a8._4_4_ = QVar22.y1.m_i.m_i;
      local_2a8._0_4_ = local_2a8._8_4_ + iVar21 + 1;
      local_2a8._8_4_ = ((iVar17 + QVar22.x2.m_i.m_i) - QVar22.x1.m_i) + ~local_2a8._8_4_;
      RStack_29c.m_i = QVar22.y2.m_i.m_i;
      LVar19 = opt->direction;
LAB_00368e6f:
      _local_2c8 = QStyle::visualRect(LVar19,&opt->rect,(QRect *)local_2a8);
      goto LAB_0036965a;
    }
    break;
  case SE_CheckBoxFocusRect:
  case SE_CheckBoxClickRect:
switchD_00368896_caseD_4:
LAB_00368c7d:
    _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,se,opt,w);
    goto LAB_0036965a;
  case SE_RadioButtonFocusRect:
  case SE_RadioButtonClickRect:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
         local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (bVar10 = hasStyleRule(this,&w->super_QObject,5), bVar10)) {
LAB_00368cbb:
      _local_2c8 = opt->rect;
      goto LAB_0036965a;
    }
    break;
  case SE_ProgressBarGroove:
  case SE_ProgressBarContents:
  case SE_ProgressBarLabel:
    if ((((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 6)) &&
       ((((local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
          ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
           (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->
             d).ptr != (QStyleSheetBorderImageData *)0x0 ||
            (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) ||
         (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0)) ||
        (bVar10 = hasStyleRule(this,&w->super_QObject,0x2d), bVar10)))) {
      if (se == SE_ProgressBarContents) {
        _local_2c8 = QRenderRule::contentsRect(&local_c0,&opt->rect);
      }
      else if (se == SE_ProgressBarGroove) {
        _local_2c8 = QRenderRule::borderRect(&local_c0,&opt->rect);
      }
      else {
        uVar14 = QFontMetrics::size((int)opt + 0x20,(QString *)0x0,(int)opt + 0x50,(int *)0x0);
        local_2a8._0_4_ = (int)uVar14;
        local_2a8._4_4_ = (int)((ulong)uVar14 >> 0x20);
        pQVar18 = &opt[1].palette;
        if (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
          pQVar18 = (QPalette *)((long)local_c0.p.d.ptr + 0x20);
        }
        _local_2c8 = QStyle::alignedRect(LeftToRight,
                                         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                                         *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar18->d,
                                         (QSize *)local_2a8,&opt->rect);
      }
      goto LAB_0036965a;
    }
    break;
  case SE_ToolBoxTabContents:
    if ((w != (QWidget *)0x0) &&
       (bVar10 = hasStyleRule(this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),0x14), bVar10)) {
      memset((QRenderRule *)local_2a8,0xaa,0x88);
      renderRule((QRenderRule *)local_2a8,this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),opt,0x14
                );
      LVar19 = opt->direction;
      local_148._0_16_ = QRenderRule::contentsRect((QRenderRule *)local_2a8,&opt->rect);
      _local_2c8 = QStyle::visualRect(LVar19,&opt->rect,(QRect *)&local_148);
      goto LAB_003691d9;
    }
    break;
  case SE_HeaderLabel:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x2a);
    if ((QStack_270.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((QStack_260.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_260.d.ptr + 0x68))->d).
          ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)QStack_260.d.ptr + 0x38) != BorderStyle_Native)))))) {
      stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
      local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      _local_2c8 = QRenderRule::contentsRect((QRenderRule *)local_2a8,&opt->rect);
      if ((opt != (QStyleOption *)0x0) &&
         (((0 < opt->version && (opt->type == 8)) && (*(int *)((long)&opt[1].styleObject + 4) != 0))
         )) {
        auVar23 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
        if (auVar23._4_4_ <= auVar23._12_4_ && auVar23._0_4_ <= auVar23._8_4_) {
          bVar10 = -1 < (char)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                              super_QFlagsStorage<QStyle::StateFlag>.i;
          uVar3 = auVar23._8_8_ >> 0x20;
          if (!bVar10) {
            uVar3 = auVar23._8_8_;
          }
          uVar4 = auVar23._0_8_ >> 0x20;
          if (!bVar10) {
            uVar4 = auVar23._0_8_;
          }
          *(uint *)(local_2c8 + (ulong)bVar10 * 4 + 8) =
               *(int *)(local_2c8 + (ulong)bVar10 * 4 + 8) + ~(uint)uVar3 + (int)uVar4;
        }
      }
      pQVar20 = (QRenderRule *)local_2a8;
      goto LAB_003691e6;
    }
LAB_00369403:
    pQVar20 = (QRenderRule *)local_2a8;
LAB_00369627:
    QRenderRule::~QRenderRule(pQVar20);
    break;
  case SE_HeaderArrow:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x2b);
    if (QStack_250.d.ptr == (QStyleSheetGeometryData *)0x0 &&
        local_248.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_00369403;
    LVar19 = opt->direction;
    iVar21 = 0x2b;
LAB_003691d1:
    _local_2c8 = positionRect(this,w,&local_c0,(QRenderRule *)local_2a8,iVar21,&opt->rect,LVar19);
LAB_003691d9:
    pQVar20 = (QRenderRule *)local_2a8;
    goto LAB_003691e6;
  case SE_TabWidgetTabBar:
    iVar21 = 0x37;
    bVar10 = true;
    sr = se;
  case SE_TabWidgetTabPane:
  case SE_TabWidgetTabContents:
    goto switchD_00368896_caseD_13;
  case SE_TabWidgetLeftCorner:
    iVar21 = 0x38;
    goto LAB_003691f6;
  case SE_TabWidgetRightCorner:
    iVar21 = 0x39;
LAB_003691f6:
    bVar10 = false;
    sr = se;
switchD_00368896_caseD_13:
    bVar11 = hasStyleRule(this,&w->super_QObject,iVar21);
    if (!bVar11) break;
    stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
    local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,sr,opt,w);
    memset(local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar21);
    _local_2c8 = positionRect(this,w,(QRenderRule *)local_2a8,iVar21,(QRect *)local_2c8,
                              opt->direction);
    if (bVar10) {
      _local_2c8 = (QRect)QRect::operator&(&opt->rect,(QRect *)local_2c8);
    }
    if (se == SE_TabWidgetTabContents) {
      _local_2c8 = QRenderRule::contentsRect((QRenderRule *)local_2a8,(QRect *)local_2c8);
    }
LAB_003692d8:
    pQVar20 = (QRenderRule *)local_2a8;
LAB_003692dd:
    QRenderRule::~QRenderRule(pQVar20);
    goto LAB_0036965a;
  case SE_ItemViewItemCheckIndicator:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 10)) {
      _local_2c8 = (QRect)(**(code **)(*(long *)this + 0xc0))(this,2,opt,w);
      goto LAB_0036965a;
    }
LAB_003688d6:
    if (opt->type == 10) {
      memset(&local_148,0xaa,0x88);
      renderRule(&local_148,this,&w->super_QObject,opt,0x4a);
      iVar21 = 0x4c;
      if ((se & ~SE_PushButtonFocusRect) != SE_ItemViewItemText) {
        if (se == SE_ItemViewItemCheckIndicator) {
          iVar21 = 0x4d;
          bVar2 = *(byte *)((long)&opt[1].palette.d + 4) & 4;
        }
        else {
          if (se != SE_ItemViewItemDecoration) goto LAB_0036961f;
          iVar21 = 0x4b;
          bVar2 = *(byte *)((long)&opt[1].palette.d + 4) & 0x10;
        }
        if (bVar2 == 0) goto LAB_0036961f;
      }
      if ((local_148.b.d.ptr == (QStyleSheetBoxData *)0x0 &&
           local_148.geo.d.ptr == (QStyleSheetGeometryData *)0x0) &&
         (((local_148.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
           (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_148.bd.d.ptr + 0x68))
             ->d).ptr == (QStyleSheetBorderImageData *)0x0 &&
            (*(BorderStyle *)((long)local_148.bd.d.ptr + 0x38) == BorderStyle_Native)))) &&
          (bVar10 = hasStyleRule(this,&w->super_QObject,iVar21), !bVar10)))) goto LAB_0036961f;
      memset(&local_1d8,0xaa,0x88);
      renderRule(&local_1d8,this,&w->super_QObject,opt,iVar21);
      memset((QStyleOptionViewItem *)local_2a8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem
                ((QStyleOptionViewItem *)local_2a8,(QStyleOptionViewItem *)opt);
      local_298 = (undefined1  [16])QRenderRule::contentsRect(&local_148,&opt->rect);
      local_2d8 = QWindowsStyle::subElementRect
                            ((QWindowsStyle *)this,se,(QStyleOption *)local_2a8,w);
      _local_2c8 = positionRect(this,w,&local_1d8,iVar21,&local_2d8,opt->direction);
      QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)local_2a8);
      QRenderRule::~QRenderRule(&local_1d8);
      pQVar20 = &local_148;
      goto LAB_003691e6;
    }
    break;
  case SE_TabBarTearIndicator:
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,0x30);
    if (((QStack_250.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)QStack_250.d.ptr + 0xc) == -1 &&
         (*(int *)((long)QStack_250.d.ptr + 0x10) == -1)))) &&
       ((QStack_240 == (QSize)0x0 ||
        ((*(int *)((long)QStack_240 + 0x14) < 0 || (*(int *)((long)QStack_240 + 0x18) < 0))))))
    goto LAB_00369403;
    _local_2c8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    QVar22 = _local_2c8;
    if ((opt != (QStyleOption *)0x0) && ((0 < opt->version && (opt->type == 3)))) {
      if ((uint)opt[1].version < 8) {
        if ((0x33U >> (opt[1].version & 0x1fU) & 1) == 0) {
          uVar1 = (opt->rect).y1;
          auVar7._0_4_ = (opt->rect).x1;
          auVar7._4_4_ = (opt->rect).y1;
          auVar7._8_4_ = (opt->rect).x2;
          QVar13 = QRenderRule::size((QRenderRule *)local_2a8);
          RStack_2bc.m_i = uVar1 + QVar13.ht.m_i.m_i + -1;
          local_2c8 = auVar7;
        }
        else {
          pQVar15 = &opt->rect;
          iVar21 = (pQVar15->x1).m_i;
          iVar17 = (opt->rect).y1.m_i;
          uVar5 = pQVar15->x1;
          uVar6 = pQVar15->y1;
          local_2c8._4_4_ = uVar6;
          local_2c8._0_4_ = uVar5;
          uVar14 = local_2c8._0_8_;
          _local_2c8 = QVar22;
          QVar13 = QRenderRule::size((QRenderRule *)local_2a8);
          RStack_2bc.m_i = ((opt->rect).y2.m_i + iVar17) - (opt->rect).y1.m_i;
          local_2c8._8_4_ = QVar13.wd.m_i.m_i + iVar21 + -1;
          local_2c8 = CONCAT48(local_2c8._8_4_,uVar14);
        }
      }
      _local_2c8 = QStyle::visualRect(opt->direction,&opt->rect,(QRect *)local_2c8);
    }
    goto LAB_003692d8;
  case SE_LineEditContents:
  case SE_FrameContents:
  case SE_ShapedFrameContents:
    if ((local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d).
          ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      LVar19 = opt->direction;
      _local_2a8 = QRenderRule::contentsRect(&local_c0,&opt->rect);
      goto LAB_00368e6f;
    }
    break;
  case SE_DockWidgetCloseButton:
  case SE_DockWidgetFloatButton:
    iVar21 = (se != SE_DockWidgetCloseButton) + 0x3b;
    memset((QRenderRule *)local_2a8,0xaa,0x88);
    renderRule((QRenderRule *)local_2a8,this,&w->super_QObject,opt,iVar21);
    if (local_248.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_00369403;
    memset(&local_148,0xaa,0x88);
    renderRule(&local_148,this,&w->super_QObject,opt,0x3a);
    pQVar20 = (QRenderRule *)local_2a8;
    _local_2c8 = positionRect(this,w,&local_148,pQVar20,iVar21,&opt->rect,opt->direction);
    QRenderRule::~QRenderRule(&local_148);
LAB_003691e6:
    QRenderRule::~QRenderRule(pQVar20);
    goto LAB_0036965a;
  case SE_CheckBoxLayoutItem:
  case SE_ComboBoxLayoutItem:
  case SE_DateTimeEditLayoutItem:
  case SE_LabelLayoutItem:
  case SE_ProgressBarLayoutItem:
  case SE_PushButtonLayoutItem:
  case SE_RadioButtonLayoutItem:
  case SE_SliderLayoutItem:
  case SE_SpinBoxLayoutItem:
  case SE_ToolButtonLayoutItem:
  case SE_FrameLayoutItem:
  case SE_GroupBoxLayoutItem:
  case SE_TabWidgetLayoutItem:
    if ((local_c0.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_c0.bd.d.ptr + 0x68))->d).
         ptr != (QStyleSheetBorderImageData *)0x0 ||
        (*(BorderStyle *)((long)local_c0.bd.d.ptr + 0x38) != BorderStyle_Native))))
    goto LAB_00368cbb;
    break;
  case SE_ItemViewItemDecoration:
  case SE_ItemViewItemText:
  case SE_ItemViewItemFocusRect:
    if ((opt != (QStyleOption *)0x0) && (0 < opt->version)) goto LAB_003688d6;
    break;
  case SE_TabBarTabLeftButton:
  case SE_TabBarTabRightButton:
  case SE_TabBarTabText:
    memset(&local_148,0xaa,0x88);
    renderRule(&local_148,this,&w->super_QObject,opt,0x2e);
    if ((local_148.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       (((local_148.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_148.bd.d.ptr + 0x68))->d
           ).ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)local_148.bd.d.ptr + 0x38) == BorderStyle_Native)))) &&
        (local_148.hasFont != true)))) {
LAB_0036961f:
      pQVar20 = &local_148;
      goto LAB_00369627;
    }
    if (((opt == (QStyleOption *)0x0 || se != SE_TabBarTabText) || (opt->version < 1)) ||
       (opt->type != 3)) {
      _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,se,opt,w);
    }
    else {
      this_00 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      if ((this_00 == (QTabBar *)0x0) || (iVar21 = opt[2].rect.x2.m_i, iVar21 == -1)) {
        local_1d8._0_16_ = opt->rect;
      }
      else {
        local_1d8._0_16_ = QTabBar::tabRect(this_00,iVar21);
      }
      local_2d8 = positionRect(this,w,&local_148,0x2e,(QRect *)&local_1d8,opt->direction);
      memset((QStyleOptionTab *)local_2a8,0xaa,0xa0);
      QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)local_2a8,(QStyleOptionTab *)opt);
      if (local_148.hasFont == true) {
        local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
        if (w == (QWidget *)0x0) {
          QFont::QFont((QFont *)&local_2b8,(QFont *)((long)&local_148 + 0x10));
        }
        else {
          QFont::resolve((QFont *)&local_2b8);
        }
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_2e0,(QFont *)&local_2b8);
        puVar9 = local_288;
        local_288 = local_2e0;
        local_2e0 = puVar9;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_2e0);
        QFont::~QFont((QFont *)&local_2b8);
      }
      local_298 = (undefined1  [16])QRenderRule::contentsRect(&local_148,&local_2d8);
      _local_2c8 = QWindowsStyle::subElementRect
                             ((QWindowsStyle *)this,SE_TabBarTabText,(QStyleOption *)local_2a8,w);
      QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)local_2a8);
    }
    pQVar20 = &local_148;
    goto LAB_003692dd;
  case SE_ToolBarHandle:
    bVar10 = hasStyleRule(this,&w->super_QObject,0x21);
    if (bVar10) {
      se = SE_ToolBarHandle;
      goto LAB_00368c7d;
    }
    break;
  case SE_TabBarScrollLeftButton:
  case SE_TabBarScrollRightButton:
    bVar10 = hasStyleRule(this,&w->super_QObject,0x2f);
    if (bVar10) goto switchD_00368896_caseD_4;
  }
  pQVar12 = baseStyle(this);
  _local_2c8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,se,opt,w);
LAB_0036965a:
  QRenderRule::~QRenderRule(&local_c0);
  if (pQVar8 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_00369677:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return _local_2c8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::subElementRect(SubElement se, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subElementRect(se, opt, w))

    QRenderRule rule = renderRule(w, opt);
#if QT_CONFIG(tabbar)
    int pe = PseudoElement_None;
#endif

    switch (se) {
    case SE_PushButtonContents:
    case SE_PushButtonBevel:
    case SE_PushButtonFocusRect:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::HasMenu
                && hasStyleRule(w, PseudoElement_PushButtonMenuIndicator)) {
                QStyleOptionButton btnOpt(*btn);
                btnOpt.features &= ~QStyleOptionButton::HasMenu;
                return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, &btnOpt, w)
                                               : QWindowsStyle::subElementRect(se, &btnOpt, w);
            }
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                return visualRect(opt->direction, opt->rect, se == SE_PushButtonBevel
                                                                ? rule.borderRect(opt->rect)
                                                                : rule.contentsRect(opt->rect));
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, btn, w)
                                           : QWindowsStyle::subElementRect(se, btn, w);
        }
        break;

    case SE_LineEditContents:
    case SE_FrameContents:
    case SE_ShapedFrameContents:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return visualRect(opt->direction, opt->rect, rule.contentsRect(opt->rect));
        }
        break;

    case SE_CheckBoxIndicator:
    case SE_RadioButtonIndicator:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            PseudoElement pe = se == SE_CheckBoxIndicator ? PseudoElement_Indicator : PseudoElement_ExclusiveIndicator;
            QRenderRule subRule = renderRule(w, opt, pe);
            return positionRect(w, rule, subRule, pe, opt->rect, opt->direction);
        }
        break;

    case SE_CheckBoxContents:
    case SE_RadioButtonContents:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            bool isRadio = se == SE_RadioButtonContents;
            QRect ir = subElementRect(isRadio ? SE_RadioButtonIndicator : SE_CheckBoxIndicator,
                                      opt, w);
            ir = visualRect(opt->direction, opt->rect, ir);
            int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing : PM_CheckBoxLabelSpacing, nullptr, w);
            QRect cr = rule.contentsRect(opt->rect);
            ir.setRect(ir.left() + ir.width() + spacing, cr.y(),
                       cr.width() - ir.width() - spacing, cr.height());
            return visualRect(opt->direction, opt->rect, ir);
        }
        break;

    case SE_ToolBoxTabContents:
        if (w && hasStyleRule(w->parentWidget(), PseudoElement_ToolBoxTab)) {
            QRenderRule subRule = renderRule(w->parentWidget(), opt, PseudoElement_ToolBoxTab);
            return visualRect(opt->direction, opt->rect, subRule.contentsRect(opt->rect));
        }
        break;

    case SE_RadioButtonFocusRect:
    case SE_RadioButtonClickRect: // focusrect | indicator
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            return opt->rect;
        }
        break;

    case SE_CheckBoxFocusRect:
    case SE_CheckBoxClickRect: // relies on indicator and contents
        return ParentStyle::subElementRect(se, opt, w);

#if QT_CONFIG(itemviews)
    case SE_ItemViewItemCheckIndicator:
        if (!qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            return subElementRect(SE_CheckBoxIndicator, opt, w);
        }
        Q_FALLTHROUGH();
    case SE_ItemViewItemText:
    case SE_ItemViewItemDecoration:
    case SE_ItemViewItemFocusRect:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
            PseudoElement pe = PseudoElement_None;
            if (se == SE_ItemViewItemText || se == SE_ItemViewItemFocusRect)
                pe = PseudoElement_ViewItemText;
            else if (se == SE_ItemViewItemDecoration && vopt->features & QStyleOptionViewItem::HasDecoration)
                pe = PseudoElement_ViewItemIcon;
            else if (se == SE_ItemViewItemCheckIndicator && vopt->features & QStyleOptionViewItem::HasCheckIndicator)
                pe = PseudoElement_ViewItemIndicator;
            else
                break;
            if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || hasStyleRule(w, pe)) {
                QRenderRule subRule2 = renderRule(w, opt, pe);
                QStyleOptionViewItem optCopy(*vopt);
                optCopy.rect = subRule.contentsRect(vopt->rect);
                QRect rect = ParentStyle::subElementRect(se, &optCopy, w);
                return positionRect(w, subRule2, pe, rect, opt->direction);
            }
         }
        break;
#endif // QT_CONFIG(itemviews)

    case SE_HeaderArrow: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewUpArrow);
        if (subRule.hasPosition() || subRule.hasGeometry())
            return positionRect(w, rule, subRule, PseudoElement_HeaderViewUpArrow, opt->rect, opt->direction);
                         }
        break;

    case SE_HeaderLabel: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
        if (subRule.hasBox() || !subRule.hasNativeBorder()) {
            auto r = subRule.contentsRect(opt->rect);
            if (const QStyleOptionHeader *header = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                // Subtract width needed for arrow, if there is one
                if (header->sortIndicator != QStyleOptionHeader::None) {
                    const auto arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (arrowRect.isValid()) {
                        if (opt->state & State_Horizontal)
                            r.setWidth(r.width() - arrowRect.width());
                        else
                            r.setHeight(r.height() - arrowRect.height());
                    }
                }
            }
            return r;
        }
                         }
        break;

    case SE_ProgressBarGroove:
    case SE_ProgressBarContents:
    case SE_ProgressBarLabel:
        if (const QStyleOptionProgressBar *pb = qstyleoption_cast<const QStyleOptionProgressBar *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder() || rule.hasPosition() || hasStyleRule(w, PseudoElement_ProgressBarChunk)) {
                if (se == SE_ProgressBarGroove)
                    return rule.borderRect(pb->rect);
                else if (se == SE_ProgressBarContents)
                    return rule.contentsRect(pb->rect);

                QSize sz = pb->fontMetrics.size(0, pb->text);
                return QStyle::alignedRect(Qt::LeftToRight, rule.hasPosition() ? rule.position()->textAlignment : pb->textAlignment,
                                           sz, pb->rect);
            }
        }
        break;

#if QT_CONFIG(tabbar)
    case SE_TabWidgetLeftCorner:
        pe = PseudoElement_TabWidgetLeftCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetRightCorner:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetRightCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabBar:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetTabBar;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabPane:
    case SE_TabWidgetTabContents:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetPane;

        if (hasStyleRule(w, pe)) {
            QRect r = QWindowsStyle::subElementRect(pe == PseudoElement_TabWidgetPane ? SE_TabWidgetTabPane : se, opt, w);
            QRenderRule subRule = renderRule(w, opt, pe);
            r = positionRect(w, subRule, pe, r, opt->direction);
            if (pe == PseudoElement_TabWidgetTabBar) {
                Q_ASSERT(opt);
                r = opt->rect.intersected(r);
            }
            if (se == SE_TabWidgetTabContents)
                r = subRule.contentsRect(r);
            return r;
        }
        break;

    case SE_TabBarScrollLeftButton:
    case SE_TabBarScrollRightButton:
        if (hasStyleRule(w, PseudoElement_TabBarScroller))
            return ParentStyle::subElementRect(se, opt, w);
        break;

    case SE_TabBarTearIndicator: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTear);
        if (subRule.hasContentsSize()) {
            QRect r;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    r.setRect(tab->rect.left(), tab->rect.top(), subRule.size().width(), opt->rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    r.setRect(tab->rect.left(), tab->rect.top(), opt->rect.width(), subRule.size().height());
                    break;
                default:
                    break;
                }
                r = visualRect(opt->direction, opt->rect, r);
            }
            return r;
        }
        break;
    }
    case SE_TabBarTabText:
    case SE_TabBarTabLeftButton:
    case SE_TabBarTabRightButton: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            if (se == SE_TabBarTabText) {
                if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                    const QTabBar *bar = qobject_cast<const QTabBar *>(w);
                    const QRect optRect = bar && tab->tabIndex != -1 ? bar->tabRect(tab->tabIndex) : opt->rect;
                    const QRect r = positionRect(w, subRule, PseudoElement_TabBarTab, optRect, opt->direction);
                    QStyleOptionTab tabCopy(*tab);
                    if (subRule.hasFont) {
                        const QFont ruleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                        tabCopy.fontMetrics = QFontMetrics(ruleFont);
                    }
                    tabCopy.rect = subRule.contentsRect(r);
                    return ParentStyle::subElementRect(se, &tabCopy, w);
                }
            }
            return ParentStyle::subElementRect(se, opt, w);
        }
        break;
    }
#endif // QT_CONFIG(tabbar)

    case SE_DockWidgetCloseButton:
    case SE_DockWidgetFloatButton: {
        PseudoElement pe = (se == SE_DockWidgetCloseButton) ? PseudoElement_DockWidgetCloseButton : PseudoElement_DockWidgetFloatButton;
        QRenderRule subRule2 = renderRule(w, opt, pe);
        if (!subRule2.hasPosition())
            break;
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        return positionRect(w, subRule, subRule2, pe, opt->rect, opt->direction);
                                   }

#if QT_CONFIG(toolbar)
    case SE_ToolBarHandle:
        if (hasStyleRule(w, PseudoElement_ToolBarHandle))
            return ParentStyle::subElementRect(se, opt, w);
        break;
#endif // QT_CONFIG(toolbar)

    // On mac we make pixel adjustments to layouts which are not
    // desirable when you have custom style sheets on them
    case SE_CheckBoxLayoutItem:
    case SE_ComboBoxLayoutItem:
    case SE_DateTimeEditLayoutItem:
    case SE_LabelLayoutItem:
    case SE_ProgressBarLayoutItem:
    case SE_PushButtonLayoutItem:
    case SE_RadioButtonLayoutItem:
    case SE_SliderLayoutItem:
    case SE_SpinBoxLayoutItem:
    case SE_ToolButtonLayoutItem:
    case SE_FrameLayoutItem:
    case SE_GroupBoxLayoutItem:
    case SE_TabWidgetLayoutItem:
        if (!rule.hasNativeBorder())
            return opt->rect;
        break;

    default:
        break;
    }

    return baseStyle()->subElementRect(se, opt, w);
}